

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O0

void test_multi_field_constructors<Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined4 local_2d4;
  basic_cstring<const_char> local_2d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2c0;
  basic_cstring<const_char> local_298;
  basic_cstring<const_char> local_288;
  undefined4 local_274;
  basic_cstring<const_char> local_270;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_260;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_214;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_210;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_s2;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_s1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1f8;
  basic_cstring<const_char> local_1d0;
  basic_cstring<const_char> local_1c0;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_1ac;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_1a8;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_m2;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_m1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_190;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_148;
  undefined4 local_144;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_c3;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_130;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_e4;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_e0;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_c2;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_c1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,void> local_7c [4];
  undefined4 local_78;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_v;
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> local_c [2];
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void> m_d;
  
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
  Shared_multi_field_element_with_small_characteristics(local_c);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x16a,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_78 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
              (&local_58,&local_68,0x16a,1,2,local_c,"m_d",&local_78,"T(0)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
  Shared_multi_field_element_with_small_characteristics<int,void>(local_7c,0x138e);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_90,0x16e,&local_a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c8,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&m_c1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    m_c2.element_ = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
              (&local_c8,&m_c1,0x16e,1,2,local_7c,"m_v",&m_c2,"T(1)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
  Shared_multi_field_element_with_small_characteristics<int,void>
            ((Shared_multi_field_element_with_small_characteristics<unsigned_int,void> *)&local_e0,
             0x138e);
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
  Shared_multi_field_element_with_small_characteristics(&local_e4,&local_e0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0x173,&local_108);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_130,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&m_c3,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_144 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
              (&local_130,&m_c3,0x173,1,2,&local_e4,"m_c2",&local_144,"T(1)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
  Shared_multi_field_element_with_small_characteristics(&local_148,&local_e4);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_168);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_158,0x175,&local_168);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_190,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&m_m1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    m_m2.element_ = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
              (&local_190,&m_m1,0x175,1,2,&local_148,"m_c3",&m_m2,"T(1)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_190);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
  Shared_multi_field_element_with_small_characteristics<int,void>
            ((Shared_multi_field_element_with_small_characteristics<unsigned_int,void> *)&local_1a8,
             0x138e);
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,_void>::
  Shared_multi_field_element_with_small_characteristics(&local_1ac,&local_1a8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1c0,0x17a,&local_1d0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1f8,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&m_s1,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    m_s2.element_ = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
              (&local_1f8,&m_s1,0x17a,1,2,&local_1ac,"m_m2",&m_s2,"T(1)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
  Shared_multi_field_element_with_small_characteristics<int,void>
            ((Shared_multi_field_element_with_small_characteristics<unsigned_int,void> *)&local_210,
             0x138e);
  Gudhi::persistence_fields::
  Shared_multi_field_element_with_small_characteristics<unsigned_int,void>::
  Shared_multi_field_element_with_small_characteristics<int,void>
            ((Shared_multi_field_element_with_small_characteristics<unsigned_int,void> *)&local_214,
             0x138d);
  Gudhi::persistence_fields::swap(&local_210,&local_214);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_238);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x181,&local_238);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_260,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_274 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
              (&local_260,&local_270,0x181,1,2,&local_214,"m_s2",&local_274,"T(1)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_260);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_298);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_288,0x182,&local_298);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2c0,plVar3,(char (*) [1])0x139018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field.cpp"
               ,0x83);
    local_2d4 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Gudhi::persistence_fields::Shared_multi_field_element_with_small_characteristics<unsigned_int,void>,unsigned_int>
              (&local_2c0,&local_2d0,0x182,1,2,&local_210,"m_s1",&local_2d4,"T(0)");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void test_multi_field_constructors() {
  using T = typename MF::Element;

  // default constructor
  MF m_d;
  BOOST_CHECK_EQUAL(m_d, T(0));

  // value constructor
  MF m_v(5006);
  BOOST_CHECK_EQUAL(m_v, T(1));

  // copy constructor
  MF m_c1(5006);
  MF m_c2 = m_c1;
  BOOST_CHECK_EQUAL(m_c2, T(1));
  MF m_c3(m_c2);
  BOOST_CHECK_EQUAL(m_c3, T(1));

  // move constructor
  MF m_m1(5006);
  MF m_m2(std::move(m_m1));
  BOOST_CHECK_EQUAL(m_m2, T(1));
  // BOOST_CHECK_EQUAL(m_m1, T(0));   //does not work on windows

  // swap
  MF m_s1(5006);
  MF m_s2(5005);
  swap(m_s1, m_s2);
  BOOST_CHECK_EQUAL(m_s2, T(1));
  BOOST_CHECK_EQUAL(m_s1, T(0));
}